

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t
spvtools::val::StructuredControlFlowChecks
          (ValidationState_t *_,Function *function,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *back_edges,
          vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *postorder)

{
  set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
  *this;
  bool bVar1;
  bool bVar2;
  ConstructType CVar3;
  uint32_t uVar4;
  uint id;
  uint32_t uVar5;
  Op OVar6;
  spv_result_t sVar7;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar8;
  mapped_type *pmVar9;
  list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *this_00;
  reference this_01;
  BasicBlock *this_02;
  BasicBlock *other;
  Instruction *pIVar10;
  DiagnosticStream *pDVar11;
  reference ppBVar12;
  reference ppBVar13;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *pvVar14;
  const_reference pvVar15;
  BasicBlock *pBVar16;
  reference ppBVar17;
  reference ppVar18;
  size_type sVar19;
  ConstructType type;
  ConstructType type_00;
  pair<spvtools::val::BasicBlock_*,_bool> pVar20;
  spv_result_t error_1;
  spv_result_t error;
  Instruction *terminator;
  string local_1a98;
  string local_1a78;
  DiagnosticStream local_1a58;
  tuple<unsigned_int&,unsigned_int&> local_1880 [16];
  uint local_1870;
  uint32_t local_186c;
  uint32_t header_block_1;
  uint32_t back_edge_block_1;
  pair<unsigned_int,_unsigned_int> back_edge_1;
  const_iterator __end6;
  const_iterator __begin6;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range6;
  BasicBlock *pBStack_1840;
  bool is_back_edge;
  BasicBlock *pred_1;
  const_iterator __end5;
  const_iterator __begin5;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range5;
  BasicBlock *continue_target;
  value_type *next_inst;
  long next_index;
  Instruction *continue_inst;
  uint continue_id;
  value_type *merge_inst_1;
  long index_1;
  string local_17c8;
  string local_17a8;
  DiagnosticStream local_1788;
  BasicBlock *local_15b0;
  undefined1 local_15a8;
  BasicBlock *local_15a0;
  undefined1 local_1598;
  BasicBlock *local_1590;
  BasicBlock *merge_block;
  const_reference pvStack_1580;
  uint32_t merge_id;
  value_type *merge_inst;
  size_t index;
  DiagnosticStream local_1568;
  BasicBlock *local_1390;
  BasicBlock *pred;
  iterator __end4_1;
  iterator __begin4_1;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range4_1;
  string local_1350;
  DiagnosticStream local_1330;
  BasicBlock *local_1158;
  BasicBlock *succ;
  iterator __end4;
  iterator __begin4;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range4;
  BasicBlock *block;
  iterator __end3;
  iterator __begin3;
  ConstructBlockSet *__range3;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1100;
  undefined1 local_10a0 [8];
  string exit_name;
  string header_name;
  string construct_name;
  ConstructBlockSet construct_blocks;
  string local_1008;
  string local_fe8;
  string local_fc8;
  string local_fa8;
  DiagnosticStream local_f88;
  allocator<char> local_da9;
  string local_da8;
  string local_d88;
  string local_d68;
  string local_d48;
  DiagnosticStream local_d28;
  allocator<char> local_b49;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  DiagnosticStream local_ac8;
  string local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  DiagnosticStream local_7d0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_5f8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e0;
  undefined1 local_580 [8];
  string exit_name_1;
  string header_name_1;
  string construct_name_1;
  BasicBlock *merge;
  BasicBlock *header;
  Construct *construct;
  iterator __end2_2;
  iterator __begin2_2;
  list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *__range2_2;
  DiagnosticStream local_4d0;
  size_type local_2f8;
  size_type num_latch_blocks;
  BasicBlock *pBStack_2e8;
  uint32_t loop_header_id;
  BasicBlock *loop_header;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range2_1;
  string local_2b0;
  string local_290;
  DiagnosticStream local_270;
  tuple<unsigned_int&,unsigned_int&> local_98 [16];
  uint32_t local_88;
  uint32_t local_84;
  uint32_t header_block;
  uint32_t back_edge_block;
  pair<unsigned_int,_unsigned_int> back_edge;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range2;
  map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  loop_latch_blocks;
  vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  *postorder_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *back_edges_local;
  Function *function_local;
  ValidationState_t *__local;
  
  loop_latch_blocks._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)postorder;
  std::
  map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::map((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
         *)&__range2);
  __end2 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin(back_edges);
  back_edge = (pair<unsigned_int,_unsigned_int>)
              std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::end(back_edges);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                                     *)&back_edge), bVar1) {
    ppVar18 = __gnu_cxx::
              __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::operator*(&__end2);
    _header_block = *ppVar18;
    std::tie<unsigned_int,unsigned_int>((uint *)local_98,&local_84);
    std::tuple<unsigned_int&,unsigned_int&>::operator=
              (local_98,(pair<unsigned_int,_unsigned_int> *)&header_block);
    bVar1 = Function::IsBlockType(function,local_88,kBlockTypeLoop);
    if (!bVar1) {
      pIVar10 = ValidationState_t::FindDef(_,local_84);
      ValidationState_t::diag(&local_270,_,SPV_ERROR_INVALID_CFG,pIVar10);
      pDVar11 = DiagnosticStream::operator<<(&local_270,(char (*) [13])"Back-edges (");
      ValidationState_t::getIdName_abi_cxx11_(&local_290,_,local_84);
      pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_290);
      pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [5])" -> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_2b0,_,local_88);
      pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_2b0);
      pDVar11 = DiagnosticStream::operator<<
                          (pDVar11,(char (*) [56])
                                   ") can only be formed between a block and a loop header.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_290);
      DiagnosticStream::~DiagnosticStream(&local_270);
      goto LAB_00265193;
    }
    pmVar9 = std::
             map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                           *)&__range2,&local_88);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(pmVar9,&local_84);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&__end2);
  }
  pvVar8 = Function::ordered_blocks(function);
  __end2_1 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ::begin(pvVar8);
  loop_header = (BasicBlock *)
                std::
                vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                end(pvVar8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                             *)&loop_header), bVar1) {
    ppBVar13 = __gnu_cxx::
               __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
               ::operator*(&__end2_1);
    pBStack_2e8 = *ppBVar13;
    bVar1 = BasicBlock::structurally_reachable(pBStack_2e8);
    if ((bVar1) && (bVar1 = BasicBlock::is_type(pBStack_2e8,kBlockTypeLoop), bVar1)) {
      num_latch_blocks._4_4_ = BasicBlock::id(pBStack_2e8);
      pmVar9 = std::
               map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                             *)&__range2,(key_type_conflict *)((long)&num_latch_blocks + 4));
      local_2f8 = std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::size(pmVar9);
      if (local_2f8 != 1) {
        pIVar10 = ValidationState_t::FindDef(_,num_latch_blocks._4_4_);
        ValidationState_t::diag(&local_4d0,_,SPV_ERROR_INVALID_CFG,pIVar10);
        pDVar11 = DiagnosticStream::operator<<(&local_4d0,(char (*) [13])"Loop header ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&__range2_2,_,num_latch_blocks._4_4_);
        pDVar11 = DiagnosticStream::operator<<
                            (pDVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&__range2_2);
        pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [17])" is targeted by ");
        pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_2f8);
        pDVar11 = DiagnosticStream::operator<<
                            (pDVar11,(char (*) [56])
                                     " back-edge blocks but the standard requires exactly one");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
        std::__cxx11::string::~string((string *)&__range2_2);
        DiagnosticStream::~DiagnosticStream(&local_4d0);
        goto LAB_00265193;
      }
    }
    __gnu_cxx::
    __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
    ::operator++(&__end2_1);
  }
  this_00 = Function::constructs_abi_cxx11_(function);
  __end2_2 = std::__cxx11::list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>
             ::begin(this_00);
  construct = (Construct *)
              std::__cxx11::
              list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>::end
                        (this_00);
  do {
    bVar1 = std::operator!=(&__end2_2,(_Self *)&construct);
    if (!bVar1) {
      __local._4_4_ =
           ValidateStructuredSelections
                     (_,(vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                         *)loop_latch_blocks._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (__local._4_4_ == SPV_SUCCESS) {
        __local._4_4_ = SPV_SUCCESS;
      }
LAB_00265193:
      std::
      map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
      ::~map((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              *)&__range2);
      return __local._4_4_;
    }
    this_01 = std::_List_iterator<spvtools::val::Construct>::operator*(&__end2_2);
    this_02 = Construct::entry_block(this_01);
    bVar1 = BasicBlock::structurally_reachable(this_02);
    if (bVar1) {
      other = Construct::exit_block(this_01);
      if (other == (BasicBlock *)0x0) {
        std::__cxx11::string::string((string *)(header_name_1.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(exit_name_1.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_580);
        CVar3 = Construct::type(this_01);
        ConstructNames_abi_cxx11_(&local_5e0,(val *)(ulong)CVar3,type);
        std::tie<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_5f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&header_name_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&exit_name_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580);
        std::tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::operator=
                  ((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&> *)
                   &local_5f8,&local_5e0);
        std::
        tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~tuple(&local_5e0);
        uVar4 = BasicBlock::id(this_02);
        pIVar10 = ValidationState_t::FindDef(_,uVar4);
        ValidationState_t::diag(&local_7d0,_,SPV_ERROR_INTERNAL,pIVar10);
        std::operator+(&local_8d0,"Construct ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&header_name_1.field_2 + 8));
        std::operator+(&local_8b0,&local_8d0," with ");
        std::operator+(&local_890,&local_8b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&exit_name_1.field_2 + 8));
        std::operator+(&local_870,&local_890," ");
        uVar4 = BasicBlock::id(this_02);
        ValidationState_t::getIdName_abi_cxx11_(&local_8f0,_,uVar4);
        std::operator+(&local_850,&local_870,&local_8f0);
        std::operator+(&local_830,&local_850," does not have a ");
        std::operator+(&local_810,&local_830,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_580);
        std::operator+(&local_7f0,&local_810,". This may be a bug in the validator.");
        pDVar11 = DiagnosticStream::operator<<(&local_7d0,&local_7f0);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::__cxx11::string::~string((string *)&local_810);
        std::__cxx11::string::~string((string *)&local_830);
        std::__cxx11::string::~string((string *)&local_850);
        std::__cxx11::string::~string((string *)&local_8f0);
        std::__cxx11::string::~string((string *)&local_870);
        std::__cxx11::string::~string((string *)&local_890);
        std::__cxx11::string::~string((string *)&local_8b0);
        std::__cxx11::string::~string((string *)&local_8d0);
        DiagnosticStream::~DiagnosticStream(&local_7d0);
        std::__cxx11::string::~string((string *)local_580);
        std::__cxx11::string::~string((string *)(exit_name_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(header_name_1.field_2._M_local_buf + 8));
        goto LAB_00265193;
      }
      bVar1 = BasicBlock::structurally_dominates(this_02,other);
      if (!bVar1) {
        uVar4 = BasicBlock::id(other);
        pIVar10 = ValidationState_t::FindDef(_,uVar4);
        ValidationState_t::diag(&local_ac8,_,SPV_ERROR_INVALID_CFG,pIVar10);
        uVar4 = BasicBlock::id(this_02);
        ValidationState_t::getIdName_abi_cxx11_(&local_b08,_,uVar4);
        uVar4 = BasicBlock::id(other);
        ValidationState_t::getIdName_abi_cxx11_(&local_b28,_,uVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b48,"does not structurally dominate",&local_b49);
        ConstructErrorString(&local_ae8,this_01,&local_b08,&local_b28,&local_b48);
        pDVar11 = DiagnosticStream::operator<<(&local_ac8,&local_ae8);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
        std::__cxx11::string::~string((string *)&local_ae8);
        std::__cxx11::string::~string((string *)&local_b48);
        std::allocator<char>::~allocator(&local_b49);
        std::__cxx11::string::~string((string *)&local_b28);
        std::__cxx11::string::~string((string *)&local_b08);
        DiagnosticStream::~DiagnosticStream(&local_ac8);
        goto LAB_00265193;
      }
      bVar1 = Construct::ExitBlockIsMergeBlock(this_01);
      if ((bVar1) && (this_02 == other)) {
        uVar4 = BasicBlock::id(other);
        pIVar10 = ValidationState_t::FindDef(_,uVar4);
        ValidationState_t::diag(&local_d28,_,SPV_ERROR_INVALID_CFG,pIVar10);
        uVar4 = BasicBlock::id(this_02);
        ValidationState_t::getIdName_abi_cxx11_(&local_d68,_,uVar4);
        uVar4 = BasicBlock::id(other);
        ValidationState_t::getIdName_abi_cxx11_(&local_d88,_,uVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_da8,"does not strictly structurally dominate",&local_da9);
        ConstructErrorString(&local_d48,this_01,&local_d68,&local_d88,&local_da8);
        pDVar11 = DiagnosticStream::operator<<(&local_d28,&local_d48);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
        std::__cxx11::string::~string((string *)&local_d48);
        std::__cxx11::string::~string((string *)&local_da8);
        std::allocator<char>::~allocator(&local_da9);
        std::__cxx11::string::~string((string *)&local_d88);
        std::__cxx11::string::~string((string *)&local_d68);
        DiagnosticStream::~DiagnosticStream(&local_d28);
        goto LAB_00265193;
      }
      CVar3 = Construct::type(this_01);
      if ((CVar3 == kContinue) &&
         (bVar1 = BasicBlock::structurally_postdominates(other,this_02), !bVar1)) {
        uVar4 = BasicBlock::id(other);
        pIVar10 = ValidationState_t::FindDef(_,uVar4);
        ValidationState_t::diag(&local_f88,_,SPV_ERROR_INVALID_CFG,pIVar10);
        uVar4 = BasicBlock::id(this_02);
        ValidationState_t::getIdName_abi_cxx11_(&local_fc8,_,uVar4);
        uVar4 = BasicBlock::id(other);
        ValidationState_t::getIdName_abi_cxx11_(&local_fe8,_,uVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1008,"is not structurally post dominated by",
                   (allocator<char> *)
                   ((long)&construct_blocks._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        ConstructErrorString(&local_fa8,this_01,&local_fc8,&local_fe8,&local_1008);
        pDVar11 = DiagnosticStream::operator<<(&local_f88,&local_fa8);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
        std::__cxx11::string::~string((string *)&local_fa8);
        std::__cxx11::string::~string((string *)&local_1008);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&construct_blocks._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        std::__cxx11::string::~string((string *)&local_fe8);
        std::__cxx11::string::~string((string *)&local_fc8);
        DiagnosticStream::~DiagnosticStream(&local_f88);
        goto LAB_00265193;
      }
      Construct::blocks((ConstructBlockSet *)((long)&construct_name.field_2 + 8),this_01,function);
      std::__cxx11::string::string((string *)(header_name.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(exit_name.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_10a0);
      CVar3 = Construct::type(this_01);
      ConstructNames_abi_cxx11_(&local_1100,(val *)(ulong)CVar3,type_00);
      std::tie<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&__range3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&header_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&exit_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10a0);
      std::tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::operator=
                ((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&> *)
                 &__range3,&local_1100);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple(&local_1100);
      this = (set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
              *)((long)&construct_name.field_2 + 8);
      __end3 = std::
               set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
               ::begin(this);
      block = (BasicBlock *)
              std::
              set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
              ::end(this);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&block), bVar1) {
        ppBVar12 = std::_Rb_tree_const_iterator<spvtools::val::BasicBlock_*>::operator*(&__end3);
        pBVar16 = *ppBVar12;
        pvVar8 = BasicBlock::successors(pBVar16);
        __end4 = std::
                 vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                 begin(pvVar8);
        succ = (BasicBlock *)
               std::
               vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
               end(pvVar8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                           *)&succ), bVar1) {
          ppBVar13 = __gnu_cxx::
                     __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                     ::operator*(&__end4);
          local_1158 = *ppBVar13;
          sVar19 = std::
                   set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                   ::count((set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                            *)((long)&construct_name.field_2 + 8),&local_1158);
          if ((sVar19 == 0) && (bVar1 = Construct::IsStructuredExit(this_01,_,local_1158), !bVar1))
          {
            uVar4 = BasicBlock::id(pBVar16);
            pIVar10 = ValidationState_t::FindDef(_,uVar4);
            ValidationState_t::diag(&local_1330,_,SPV_ERROR_INVALID_CFG,pIVar10);
            pDVar11 = DiagnosticStream::operator<<(&local_1330,(char (*) [12])"block <ID> ");
            uVar4 = BasicBlock::id(pBVar16);
            ValidationState_t::getIdName_abi_cxx11_(&local_1350,_,uVar4);
            pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_1350);
            pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [12])" exits the ");
            pDVar11 = DiagnosticStream::operator<<
                                (pDVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&header_name.field_2 + 8));
            pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [17])" headed by <ID> ");
            uVar4 = BasicBlock::id(this_02);
            ValidationState_t::getIdName_abi_cxx11_((string *)&__range4_1,_,uVar4);
            pDVar11 = DiagnosticStream::operator<<
                                (pDVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&__range4_1);
            pDVar11 = DiagnosticStream::operator<<
                                (pDVar11,(char (*) [32])", but not via a structured exit");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
            std::__cxx11::string::~string((string *)&__range4_1);
            std::__cxx11::string::~string((string *)&local_1350);
            DiagnosticStream::~DiagnosticStream(&local_1330);
            bVar1 = true;
            goto LAB_00265102;
          }
          __gnu_cxx::
          __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
          ::operator++(&__end4);
        }
        if (pBVar16 != this_02) {
          pvVar8 = BasicBlock::predecessors(pBVar16);
          __end4_1 = std::
                     vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     ::begin(pvVar8);
          pred = (BasicBlock *)
                 std::
                 vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                 end(pvVar8);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4_1,
                                    (__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                     *)&pred), bVar1) {
            ppBVar13 = __gnu_cxx::
                       __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                       ::operator*(&__end4_1);
            local_1390 = *ppBVar13;
            bVar1 = BasicBlock::structurally_reachable(local_1390);
            if ((bVar1) &&
               (sVar19 = std::
                         set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                         ::count((set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                  *)((long)&construct_name.field_2 + 8),&local_1390), sVar19 == 0))
            {
              uVar4 = BasicBlock::id(local_1390);
              pIVar10 = ValidationState_t::FindDef(_,uVar4);
              ValidationState_t::diag(&local_1568,_,SPV_ERROR_INVALID_CFG,pIVar10);
              pDVar11 = DiagnosticStream::operator<<(&local_1568,(char (*) [12])"block <ID> ");
              index._4_4_ = BasicBlock::id(local_1390);
              pDVar11 = DiagnosticStream::operator<<(pDVar11,(uint *)((long)&index + 4));
              pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [18])" branches to the ");
              pDVar11 = DiagnosticStream::operator<<
                                  (pDVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&header_name.field_2 + 8));
              pDVar11 = DiagnosticStream::operator<<
                                  (pDVar11,(char (*) [28])" construct, but not to the ");
              pDVar11 = DiagnosticStream::operator<<
                                  (pDVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&exit_name.field_2 + 8));
              pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [7])0x6333bc);
              index._0_4_ = BasicBlock::id(this_02);
              pDVar11 = DiagnosticStream::operator<<(pDVar11,(uint *)&index);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
              DiagnosticStream::~DiagnosticStream(&local_1568);
              bVar1 = true;
              goto LAB_00265102;
            }
            __gnu_cxx::
            __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
            ::operator++(&__end4_1);
          }
          bVar1 = BasicBlock::is_type(pBVar16,kBlockTypeSelection);
          if ((bVar1) || (bVar1 = BasicBlock::is_type(pBVar16,kBlockTypeLoop), bVar1)) {
            pIVar10 = BasicBlock::terminator(pBVar16);
            pvVar14 = ValidationState_t::ordered_instructions(_);
            pvVar15 = std::
                      vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                      ::operator[](pvVar14,0);
            merge_inst = (value_type *)(((long)pIVar10 - (long)pvVar15) / 0x88 + -1);
            pvVar14 = ValidationState_t::ordered_instructions(_);
            pvStack_1580 = std::
                           vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                           ::operator[](pvVar14,(size_type)merge_inst);
            OVar6 = Instruction::opcode(pvStack_1580);
            if ((OVar6 == OpSelectionMerge) ||
               (OVar6 = Instruction::opcode(pvStack_1580), OVar6 == OpLoopMerge)) {
              merge_block._4_4_ = Instruction::GetOperandAs<unsigned_int>(pvStack_1580,0);
              pVar20 = Function::GetBlock(function,merge_block._4_4_);
              local_15b0 = pVar20.first;
              local_15a8 = pVar20.second;
              local_15a0 = local_15b0;
              local_1598 = local_15a8;
              local_1590 = local_15b0;
              bVar1 = BasicBlock::structurally_reachable(local_15b0);
              if ((bVar1) &&
                 (sVar19 = std::
                           set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                           ::count((set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                    *)((long)&construct_name.field_2 + 8),&local_1590), sVar19 == 0)
                 ) {
                uVar4 = BasicBlock::id(pBVar16);
                pIVar10 = ValidationState_t::FindDef(_,uVar4);
                ValidationState_t::diag(&local_1788,_,SPV_ERROR_INVALID_CFG,pIVar10);
                pDVar11 = DiagnosticStream::operator<<(&local_1788,(char (*) [14])"Header block ");
                uVar4 = BasicBlock::id(pBVar16);
                ValidationState_t::getIdName_abi_cxx11_(&local_17a8,_,uVar4);
                pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_17a8);
                pDVar11 = DiagnosticStream::operator<<
                                    (pDVar11,(char (*) [22])" is contained in the ");
                pDVar11 = DiagnosticStream::operator<<
                                    (pDVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)((long)&header_name.field_2 + 8));
                pDVar11 = DiagnosticStream::operator<<
                                    (pDVar11,(char (*) [22])" construct headed by ");
                uVar4 = BasicBlock::id(this_02);
                ValidationState_t::getIdName_abi_cxx11_(&local_17c8,_,uVar4);
                pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_17c8);
                pDVar11 = DiagnosticStream::operator<<
                                    (pDVar11,(char (*) [23])", but its merge block ");
                ValidationState_t::getIdName_abi_cxx11_((string *)&index_1,_,merge_block._4_4_);
                pDVar11 = DiagnosticStream::operator<<
                                    (pDVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&index_1);
                pDVar11 = DiagnosticStream::operator<<(pDVar11,(char (*) [8])" is not");
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
                std::__cxx11::string::~string((string *)&index_1);
                std::__cxx11::string::~string((string *)&local_17c8);
                std::__cxx11::string::~string((string *)&local_17a8);
                DiagnosticStream::~DiagnosticStream(&local_1788);
                bVar1 = true;
                goto LAB_00265102;
              }
            }
          }
        }
        std::_Rb_tree_const_iterator<spvtools::val::BasicBlock_*>::operator++(&__end3);
      }
      CVar3 = Construct::type(this_01);
      if (CVar3 == kLoop) {
        pIVar10 = BasicBlock::terminator(this_02);
        pvVar14 = ValidationState_t::ordered_instructions(_);
        pvVar15 = std::
                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                  operator[](pvVar14,0);
        pvVar14 = ValidationState_t::ordered_instructions(_);
        pvVar15 = std::
                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                  operator[](pvVar14,((long)pIVar10 - (long)pvVar15) / 0x88 - 1);
        id = Instruction::GetOperandAs<unsigned_int>(pvVar15,1);
        pIVar10 = ValidationState_t::FindDef(_,id);
        pvVar14 = ValidationState_t::ordered_instructions(_);
        pvVar15 = std::
                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                  operator[](pvVar14,0);
        pvVar14 = ValidationState_t::ordered_instructions(_);
        pvVar15 = std::
                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                  operator[](pvVar14,((long)pIVar10 - (long)pvVar15) / 0x88 + 1);
        pBVar16 = Instruction::block(pvVar15);
        uVar4 = BasicBlock::id(this_02);
        if (uVar4 != id) {
          pvVar8 = BasicBlock::predecessors(pBVar16);
          __end5 = std::
                   vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   ::begin(pvVar8);
          pred_1 = (BasicBlock *)
                   std::
                   vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   ::end(pvVar8);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                             *)&pred_1), bVar1) {
            ppBVar17 = __gnu_cxx::
                       __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                       ::operator*(&__end5);
            pBStack_1840 = *ppBVar17;
            bVar1 = false;
            __end6 = std::
                     vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ::begin(back_edges);
            back_edge_1 = (pair<unsigned_int,_unsigned_int>)
                          std::
                          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ::end(back_edges);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                                               *)&back_edge_1), bVar2) {
              ppVar18 = __gnu_cxx::
                        __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                        ::operator*(&__end6);
              _header_block_1 = *ppVar18;
              std::tie<unsigned_int,unsigned_int>((uint *)local_1880,&local_186c);
              std::tuple<unsigned_int&,unsigned_int&>::operator=
                        (local_1880,(pair<unsigned_int,_unsigned_int> *)&header_block_1);
              uVar4 = local_186c;
              if ((local_1870 == id) && (uVar5 = BasicBlock::id(pBStack_1840), uVar4 == uVar5)) {
                bVar1 = true;
              }
              __gnu_cxx::
              __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::operator++(&__end6);
            }
            sVar19 = std::
                     set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                     ::count((set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                              *)((long)&construct_name.field_2 + 8),&stack0xffffffffffffe7c0);
            if ((sVar19 == 0) && (!bVar1)) {
              pIVar10 = BasicBlock::terminator(pBStack_1840);
              ValidationState_t::diag(&local_1a58,_,SPV_ERROR_INVALID_CFG,pIVar10);
              pDVar11 = DiagnosticStream::operator<<(&local_1a58,(char (*) [7])0x633dc5);
              uVar4 = BasicBlock::id(pBStack_1840);
              ValidationState_t::getIdName_abi_cxx11_(&local_1a78,_,uVar4);
              pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_1a78);
              pDVar11 = DiagnosticStream::operator<<
                                  (pDVar11,(char (*) [39])" branches to the loop continue target ");
              ValidationState_t::getIdName_abi_cxx11_(&local_1a98,_,id);
              pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_1a98);
              pDVar11 = DiagnosticStream::operator<<
                                  (pDVar11,(char (*) [57])
                                           ", but is not contained in the associated loop construct "
                                  );
              uVar4 = BasicBlock::id(this_02);
              ValidationState_t::getIdName_abi_cxx11_((string *)&terminator,_,uVar4);
              pDVar11 = DiagnosticStream::operator<<
                                  (pDVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&terminator);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar11);
              std::__cxx11::string::~string((string *)&terminator);
              std::__cxx11::string::~string((string *)&local_1a98);
              std::__cxx11::string::~string((string *)&local_1a78);
              DiagnosticStream::~DiagnosticStream(&local_1a58);
              bVar1 = true;
              goto LAB_00265102;
            }
            __gnu_cxx::
            __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
            ::operator++(&__end5);
          }
        }
      }
      CVar3 = Construct::type(this_01);
      if (CVar3 == kSelection) {
        pIVar10 = BasicBlock::terminator(this_02);
        OVar6 = Instruction::opcode(pIVar10);
        if (OVar6 != OpSwitch) goto LAB_002650f8;
        pIVar10 = BasicBlock::terminator(this_02);
        sVar7 = StructuredSwitchChecks(_,function,pIVar10,this_02,other);
        if (sVar7 == SPV_SUCCESS) goto LAB_002650f8;
        bVar1 = true;
        __local._4_4_ = sVar7;
      }
      else {
LAB_002650f8:
        bVar1 = false;
      }
LAB_00265102:
      std::__cxx11::string::~string((string *)local_10a0);
      std::__cxx11::string::~string((string *)(exit_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(header_name.field_2._M_local_buf + 8));
      std::
      set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
      ::~set((set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
              *)((long)&construct_name.field_2 + 8));
      if (bVar1) goto LAB_00265193;
    }
    std::_List_iterator<spvtools::val::Construct>::operator++(&__end2_2);
  } while( true );
}

Assistant:

spv_result_t StructuredControlFlowChecks(
    ValidationState_t& _, Function* function,
    const std::vector<std::pair<uint32_t, uint32_t>>& back_edges,
    const std::vector<const BasicBlock*>& postorder) {
  /// Check all backedges target only loop headers and have exactly one
  /// back-edge branching to it

  // Map a loop header to blocks with back-edges to the loop header.
  std::map<uint32_t, std::unordered_set<uint32_t>> loop_latch_blocks;
  for (auto back_edge : back_edges) {
    uint32_t back_edge_block;
    uint32_t header_block;
    std::tie(back_edge_block, header_block) = back_edge;
    if (!function->IsBlockType(header_block, kBlockTypeLoop)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(back_edge_block))
             << "Back-edges (" << _.getIdName(back_edge_block) << " -> "
             << _.getIdName(header_block)
             << ") can only be formed between a block and a loop header.";
    }
    loop_latch_blocks[header_block].insert(back_edge_block);
  }

  // Check the loop headers have exactly one back-edge branching to it
  for (BasicBlock* loop_header : function->ordered_blocks()) {
    if (!loop_header->structurally_reachable()) continue;
    if (!loop_header->is_type(kBlockTypeLoop)) continue;
    auto loop_header_id = loop_header->id();
    auto num_latch_blocks = loop_latch_blocks[loop_header_id].size();
    if (num_latch_blocks != 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(loop_header_id))
             << "Loop header " << _.getIdName(loop_header_id)
             << " is targeted by " << num_latch_blocks
             << " back-edge blocks but the standard requires exactly one";
    }
  }

  // Check construct rules
  for (const Construct& construct : function->constructs()) {
    auto header = construct.entry_block();
    if (!header->structurally_reachable()) continue;
    auto merge = construct.exit_block();

    if (!merge) {
      std::string construct_name, header_name, exit_name;
      std::tie(construct_name, header_name, exit_name) =
          ConstructNames(construct.type());
      return _.diag(SPV_ERROR_INTERNAL, _.FindDef(header->id()))
             << "Construct " + construct_name + " with " + header_name + " " +
                    _.getIdName(header->id()) + " does not have a " +
                    exit_name + ". This may be a bug in the validator.";
    }

    // If the header is reachable, the merge is guaranteed to be structurally
    // reachable.
    if (!header->structurally_dominates(*merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not structurally dominate");
    }

    // If it's really a merge block for a selection or loop, then it must be
    // *strictly* structrually dominated by the header.
    if (construct.ExitBlockIsMergeBlock() && (header == merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not strictly structurally dominate");
    }

    // Check post-dominance for continue constructs.  But dominance and
    // post-dominance only make sense when the construct is reachable.
    if (construct.type() == ConstructType::kContinue) {
      if (!merge->structurally_postdominates(*header)) {
        return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
               << ConstructErrorString(construct, _.getIdName(header->id()),
                                       _.getIdName(merge->id()),
                                       "is not structurally post dominated by");
      }
    }

    Construct::ConstructBlockSet construct_blocks = construct.blocks(function);
    std::string construct_name, header_name, exit_name;
    std::tie(construct_name, header_name, exit_name) =
        ConstructNames(construct.type());
    for (auto block : construct_blocks) {
      // Check that all exits from the construct are via structured exits.
      for (auto succ : *block->successors()) {
        if (!construct_blocks.count(succ) &&
            !construct.IsStructuredExit(_, succ)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                 << "block <ID> " << _.getIdName(block->id()) << " exits the "
                 << construct_name << " headed by <ID> "
                 << _.getIdName(header->id())
                 << ", but not via a structured exit";
        }
      }
      if (block == header) continue;
      // Check that for all non-header blocks, all predecessors are within this
      // construct.
      for (auto pred : *block->predecessors()) {
        if (pred->structurally_reachable() && !construct_blocks.count(pred)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pred->id()))
                 << "block <ID> " << pred->id() << " branches to the "
                 << construct_name << " construct, but not to the "
                 << header_name << " <ID> " << header->id();
        }
      }

      if (block->is_type(BlockType::kBlockTypeSelection) ||
          block->is_type(BlockType::kBlockTypeLoop)) {
        size_t index = (block->terminator() - &_.ordered_instructions()[0]) - 1;
        const auto& merge_inst = _.ordered_instructions()[index];
        if (merge_inst.opcode() == spv::Op::OpSelectionMerge ||
            merge_inst.opcode() == spv::Op::OpLoopMerge) {
          uint32_t merge_id = merge_inst.GetOperandAs<uint32_t>(0);
          auto merge_block = function->GetBlock(merge_id).first;
          if (merge_block->structurally_reachable() &&
              !construct_blocks.count(merge_block)) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                   << "Header block " << _.getIdName(block->id())
                   << " is contained in the " << construct_name
                   << " construct headed by " << _.getIdName(header->id())
                   << ", but its merge block " << _.getIdName(merge_id)
                   << " is not";
          }
        }
      }
    }

    if (construct.type() == ConstructType::kLoop) {
      // If the continue target differs from the loop header, then check that
      // all edges into the continue construct come from within the loop.
      const auto index = header->terminator() - &_.ordered_instructions()[0];
      const auto& merge_inst = _.ordered_instructions()[index - 1];
      const auto continue_id = merge_inst.GetOperandAs<uint32_t>(1);
      const auto* continue_inst = _.FindDef(continue_id);
      // OpLabel instructions aren't stored as part of the basic block for
      // legacy reaasons. Grab the next instruction and use it's block pointer
      // instead.
      const auto next_index =
          (continue_inst - &_.ordered_instructions()[0]) + 1;
      const auto& next_inst = _.ordered_instructions()[next_index];
      const auto* continue_target = next_inst.block();
      if (header->id() != continue_id) {
        for (auto pred : *continue_target->predecessors()) {
          // Ignore back-edges from within the continue construct.
          bool is_back_edge = false;
          for (auto back_edge : back_edges) {
            uint32_t back_edge_block;
            uint32_t header_block;
            std::tie(back_edge_block, header_block) = back_edge;
            if (header_block == continue_id && back_edge_block == pred->id())
              is_back_edge = true;
          }
          if (!construct_blocks.count(pred) && !is_back_edge) {
            return _.diag(SPV_ERROR_INVALID_CFG, pred->terminator())
                   << "Block " << _.getIdName(pred->id())
                   << " branches to the loop continue target "
                   << _.getIdName(continue_id)
                   << ", but is not contained in the associated loop construct "
                   << _.getIdName(header->id());
          }
        }
      }
    }

    // Checks rules for case constructs.
    if (construct.type() == ConstructType::kSelection &&
        header->terminator()->opcode() == spv::Op::OpSwitch) {
      const auto terminator = header->terminator();
      if (auto error =
              StructuredSwitchChecks(_, function, terminator, header, merge)) {
        return error;
      }
    }
  }

  if (auto error = ValidateStructuredSelections(_, postorder)) {
    return error;
  }

  return SPV_SUCCESS;
}